

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<VkSpecParser::TypedName>::reallocateAndGrow
          (QArrayDataPointer<VkSpecParser::TypedName> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<VkSpecParser::TypedName> *old)

{
  TypedName *pTVar1;
  Data *pDVar2;
  qsizetype qVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<VkSpecParser::TypedName> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = -0x5555555555555556;
  local_38.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_38.ptr = (TypedName *)0xaaaaaaaaaaaaaaaa;
  allocateGrow(&local_38,this,n,where);
  if (this->size != 0) {
    if (this->d == (Data *)0x0) {
      bVar4 = true;
    }
    else {
      bVar4 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    pTVar1 = this->ptr;
    if ((old != (QArrayDataPointer<VkSpecParser::TypedName> *)0x0) || (bVar4)) {
      QtPrivate::QGenericArrayOps<VkSpecParser::TypedName>::copyAppend
                ((QGenericArrayOps<VkSpecParser::TypedName> *)&local_38,pTVar1,
                 pTVar1 + this->size + (n >> 0x3f & n));
    }
    else {
      QtPrivate::QGenericArrayOps<VkSpecParser::TypedName>::moveAppend
                ((QGenericArrayOps<VkSpecParser::TypedName> *)&local_38,pTVar1,
                 pTVar1 + this->size + (n >> 0x3f & n));
    }
  }
  pDVar2 = this->d;
  pTVar1 = this->ptr;
  this->d = local_38.d;
  this->ptr = local_38.ptr;
  qVar3 = this->size;
  this->size = local_38.size;
  local_38.d = pDVar2;
  local_38.ptr = pTVar1;
  local_38.size = qVar3;
  if (old != (QArrayDataPointer<VkSpecParser::TypedName> *)0x0) {
    local_38.d = old->d;
    local_38.ptr = old->ptr;
    old->d = pDVar2;
    old->ptr = pTVar1;
    local_38.size = old->size;
    old->size = qVar3;
  }
  ~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }